

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  ArrayIndex AVar4;
  ArrayIndex AVar5;
  int iVar6;
  Value *pVVar7;
  bool local_42;
  uint local_38;
  uint local_34;
  ArrayIndex index_1;
  ArrayIndex lineLength;
  Value *childValue;
  bool local_1d;
  ArrayIndex index;
  bool isMultiLine;
  ArrayIndex size;
  Value *value_local;
  StyledStreamWriter *this_local;
  
  AVar4 = Value::size(value);
  local_1d = this->rightMargin_ <= AVar4 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  childValue._4_4_ = 0;
  do {
    bVar1 = 0;
    if (childValue._4_4_ < AVar4) {
      bVar1 = local_1d ^ 1;
    }
    if (bVar1 == 0) {
      if (local_1d == false) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->childValues_,(ulong)AVar4);
        this->field_0x68 = this->field_0x68 & 0xfe | 1;
        local_34 = (AVar4 - 1) * 2 + 4;
        bVar2 = false;
        for (local_38 = 0; local_38 < AVar4; local_38 = local_38 + 1) {
          pVVar7 = Value::operator[](value,local_38);
          bVar3 = hasCommentForValue(this,pVVar7);
          if (bVar3) {
            bVar2 = true;
          }
          pVVar7 = Value::operator[](value,local_38);
          writeValue(this,pVVar7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->childValues_,(ulong)local_38);
          iVar6 = std::__cxx11::string::length();
          local_34 = iVar6 + local_34;
        }
        this->field_0x68 = this->field_0x68 & 0xfe;
        local_1d = true;
        if (!bVar2) {
          local_1d = this->rightMargin_ <= local_34;
        }
      }
      return local_1d;
    }
    pVVar7 = Value::operator[](value,childValue._4_4_);
    bVar2 = Value::isArray(pVVar7);
    if (bVar2) {
LAB_0087c255:
      AVar5 = Value::size(pVVar7);
      local_42 = AVar5 != 0;
    }
    else {
      bVar2 = Value::isObject(pVVar7);
      local_42 = false;
      if (bVar2) goto LAB_0087c255;
    }
    local_1d = local_42;
    childValue._4_4_ = childValue._4_4_ + 1;
  } while( true );
}

Assistant:

bool StyledStreamWriter::isMultineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}